

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovEntries.cpp
# Opt level: O0

cl_context
clCreateContext(cl_context_properties *properties,cl_uint num_devices,cl_device_id *devices,
               _func_void_char_ptr_void_ptr_size_t_void_ptr *pfn_notify,void *user_data,
               cl_int *errcode_ret)

{
  bool bVar1;
  uint local_4c;
  cl_uint i_1;
  bool hasPlatformProperties;
  uint32_t i;
  cl_int *errcode_ret_local;
  void *user_data_local;
  _func_void_char_ptr_void_ptr_size_t_void_ptr *pfn_notify_local;
  cl_device_id *devices_local;
  cl_uint num_devices_local;
  cl_context_properties *properties_local;
  
  if (properties != (cl_context_properties *)0x0) {
    bVar1 = false;
    for (i_1 = 0; properties[i_1] != 0; i_1 = i_1 + 2) {
      if (properties[i_1] != 0x1084) {
        *errcode_ret = -0x40;
        return (cl_context)0x0;
      }
      if (bVar1) {
        *errcode_ret = -0x40;
        return (cl_context)0x0;
      }
      bVar1 = cov::isValidObject<cov::Platform>((void *)properties[i_1 + 1]);
      if (!bVar1) {
        *errcode_ret = -0x20;
        return (cl_context)0x0;
      }
      bVar1 = true;
    }
  }
  if ((devices == (cl_device_id *)0x0) || (num_devices == 0)) {
    *errcode_ret = -0x1e;
    properties_local = (cl_context_properties *)0x0;
  }
  else if ((pfn_notify == (_func_void_char_ptr_void_ptr_size_t_void_ptr *)0x0) &&
          (user_data != (void *)0x0)) {
    *errcode_ret = -0x1e;
    properties_local = (cl_context_properties *)0x0;
  }
  else {
    for (local_4c = 0; local_4c < num_devices; local_4c = local_4c + 1) {
      bVar1 = cov::isValidObject<cov::Device>(devices[local_4c]);
      if (!bVar1) {
        *errcode_ret = -0x21;
        return (cl_context)0x0;
      }
    }
    properties_local =
         (cl_context_properties *)
         cov::createContext(properties,num_devices,devices,pfn_notify,user_data,errcode_ret);
  }
  return (cl_context)properties_local;
}

Assistant:

CL_API_ENTRY cl_context CL_API_CALL
clCreateContext(const cl_context_properties* properties,
                cl_uint num_devices,
                const cl_device_id* devices,
                void (CL_CALLBACK* pfn_notify)(const char* errinfo,
                                               const void* private_info,
                                               size_t cb,
                                               void* user_data),
                void* user_data,
                cl_int* errcode_ret) CL_API_SUFFIX__VERSION_1_0
{
    if (properties) {
        uint32_t i = 0;
        bool hasPlatformProperties = false;
        while (properties[i] != 0) {
            if (properties[i] == CL_CONTEXT_PLATFORM) {
                if (hasPlatformProperties) {
                    *errcode_ret = CL_INVALID_PROPERTY;
                    return nullptr;
                }
                if (!cov::isValidObject<cov::Platform>(reinterpret_cast<void*>(properties[i + 1]))) {
                    *errcode_ret = CL_INVALID_PLATFORM;
                    return nullptr;
                }
                hasPlatformProperties = true; // platform here not actually used
            } else {
                *errcode_ret = CL_INVALID_PROPERTY;
                return nullptr;
            }
            i += 2;
        }
    }
    if (!devices || num_devices == 0) {
        *errcode_ret = CL_INVALID_VALUE;
        return nullptr;
    }
    if (!pfn_notify && user_data) {
        *errcode_ret = CL_INVALID_VALUE;
        return nullptr;
    }
    for (cl_uint i = 0; i < num_devices; i++) {
        if (!cov::isValidObject<cov::Device>(devices[i])) {
            *errcode_ret = CL_INVALID_DEVICE;
            return nullptr;
        }
    }

    return cov::createContext(properties, num_devices, devices, pfn_notify, user_data, errcode_ret);
}